

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.h
# Opt level: O3

const_iterator __thiscall QAssociativeIterable::constBegin(QAssociativeIterable *this)

{
  void *pvVar1;
  void *extraout_RDX;
  long in_RSI;
  long in_FS_OFFSET;
  const_iterator cVar2;
  QBaseIterator<QMetaAssociation> local_38;
  QBaseIterator<QMetaAssociation> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar1 = QMetaContainer::constBegin
                     ((QMetaContainer *)(in_RSI + 0x10),
                      (void *)(*(ulong *)(in_RSI + 8) & 0xfffffffffffffffe));
  local_38.m_iterator = (void *)0x0;
  *(long *)&this->super_QIterable<QMetaAssociation> = in_RSI;
  (this->super_QIterable<QMetaAssociation>).m_iterable.m_pointer.d = (quintptr)pvVar1;
  local_28.m_iterator = (void *)0x0;
  QBaseIterator<QMetaAssociation>::clearIterator(&local_28);
  QBaseIterator<QMetaAssociation>::clearIterator(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    cVar2.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
    super_QBaseIterator<QMetaAssociation>.m_iterator = extraout_RDX;
    cVar2.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
    super_QBaseIterator<QMetaAssociation>.m_iterable.m_pointer.d =
         (QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
          )(QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
            )this;
    return (const_iterator)
           cVar2.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
           super_QBaseIterator<QMetaAssociation>;
  }
  __stack_chk_fail();
}

Assistant:

const_iterator constBegin() const { return const_iterator(QIterable::constBegin()); }